

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

int __thiscall
IDisk::AddByteToSpecificTrack(IDisk *this,int side,uint track,uint index,uchar byte,int size)

{
  MFMTrack *pMVar1;
  int iVar2;
  uint uVar3;
  uchar *puVar4;
  uchar buffer [16];
  
  pMVar1 = this->side_[side].tracks;
  uVar3 = pMVar1[track].size;
  if (size + index < uVar3) {
    iVar2 = AddByteToTrackInBits(pMVar1[track].bitfield,index,byte,size,uVar3);
    return iVar2;
  }
  uVar3 = uVar3 - index;
  if ((int)uVar3 < 1) {
    iVar2 = 0;
  }
  else {
    if (index == 0) {
      AddByteToTrack(buffer,0,byte,8,'\0');
      puVar4 = pMVar1[track].bitfield;
    }
    else {
      puVar4 = pMVar1[track].bitfield;
      AddByteToTrack(buffer,0,byte,8,puVar4[index - 1]);
    }
    memcpy(puVar4 + index,buffer,(ulong)uVar3);
    iVar2 = size - uVar3;
    memcpy(this->side_[side].tracks[track].bitfield,buffer + uVar3,(long)iVar2);
  }
  return iVar2;
}

Assistant:

int IDisk::AddByteToSpecificTrack(int side, unsigned int track, unsigned int index, unsigned char byte, int size)
{
   if (index + size >= side_[side].tracks[track].size)
   {
      unsigned char buffer[16];

      const int nb_byte_to_last_track = side_[side].tracks[track].size - index;

      if (nb_byte_to_last_track > 0)
      {
         // Index should be far more than 0 ! Otherwiser, track is about 16 bit long ??
         if (index > 0)
         {
            AddByteToTrack(buffer, 0, byte, 8, side_[side].tracks[track].bitfield[index - 1]);
         }
         else
         {
            AddByteToTrack(buffer, 0, byte, 8, 0);
         }
         memcpy(&side_[side].tracks[track].bitfield[index], buffer, nb_byte_to_last_track);

         // Copy remaining to begining of the track ?
         memcpy(&side_[side].tracks[track].bitfield[0], &buffer[nb_byte_to_last_track], size - nb_byte_to_last_track);
         return (size) - nb_byte_to_last_track;
      }
      // TODO !
      return 0;
   }
   return AddByteToTrackInBits(side_[side].tracks[track].bitfield, index, byte, size, side_[side].tracks[track].size);
}